

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslsocket.cpp
# Opt level: O1

void QSslSocket::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  long lVar2;
  offset_in_QSslSocket_to_subr *candidate;
  undefined8 *puVar3;
  undefined4 uVar4;
  void **ppvVar5;
  InterfaceType *pIVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_00255321:
        *puVar3 = pIVar6;
        goto LAB_0025543f;
      }
    }
    else if (_id == 0x10) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketState>::metaType;
        goto LAB_00255321;
      }
    }
    else if (_id == 0x11) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
        goto LAB_00255321;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
    goto LAB_0025543f;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((((code *)*plVar1 == encrypted) && (uVar4 = 0, plVar1[1] == 0)) ||
           (((code *)*plVar1 == peerVerifyError && (uVar4 = 1, plVar1[1] == 0)))) ||
          (((code *)*plVar1 == sslErrors && (uVar4 = 2, plVar1[1] == 0)))) ||
         ((((code *)*plVar1 == modeChanged && (uVar4 = 3, plVar1[1] == 0)) ||
          (((((code *)*plVar1 == encryptedBytesWritten && (uVar4 = 4, plVar1[1] == 0)) ||
            (((code *)*plVar1 == preSharedKeyAuthenticationRequired && (uVar4 = 5, plVar1[1] == 0)))
            ) || (((code *)*plVar1 == newSessionTicketReceived && (uVar4 = 6, plVar1[1] == 0))))))))
        || (((code *)*plVar1 == alertSent && (uVar4 = 7, plVar1[1] == 0)))) ||
       ((((code *)*plVar1 == alertReceived && (uVar4 = 8, plVar1[1] == 0)) ||
        (((code *)*plVar1 == handshakeInterruptedOnError && (uVar4 = 9, plVar1[1] == 0)))))) {
      *(undefined4 *)*_a = uVar4;
    }
    goto LAB_0025543f;
  }
  if (_c != InvokeMetaMethod) goto LAB_0025543f;
  switch(_id) {
  case 0:
    iVar7 = 0;
    goto LAB_002552bd;
  case 1:
    puStack_30 = (undefined8 *)_a[1];
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 1;
    goto LAB_002552bf;
  case 2:
    puStack_30 = (undefined8 *)_a[1];
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 2;
    goto LAB_002552bf;
  case 3:
    puStack_30 = &local_40;
    local_40 = CONCAT44(local_40._4_4_,*_a[1]);
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 3;
    goto LAB_002552bf;
  case 4:
    local_40 = *_a[1];
    puStack_30 = &local_40;
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 4;
    goto LAB_002552bf;
  case 5:
    local_40 = *_a[1];
    puStack_30 = &local_40;
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 5;
    goto LAB_002552bf;
  case 6:
    iVar7 = 6;
LAB_002552bd:
    ppvVar5 = (void **)0x0;
    goto LAB_002552bf;
  case 7:
    alertSent((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
    break;
  case 8:
    alertReceived((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
    break;
  case 9:
    puStack_30 = (undefined8 *)_a[1];
    ppvVar5 = &local_38;
    local_38 = (void *)0x0;
    iVar7 = 9;
LAB_002552bf:
    QMetaObject::activate(_o,&staticMetaObject,iVar7,ppvVar5);
    break;
  case 10:
    startClientEncryption((QSslSocket *)_o);
    break;
  case 0xb:
    startServerEncryption((QSslSocket *)_o);
    break;
  case 0xc:
    *(undefined1 *)(*(long *)(_o + 8) + 0x276) = 1;
    break;
  case 0xd:
    QSslSocketPrivate::_q_connectedSlot(*(QSslSocketPrivate **)(_o + 8));
    break;
  case 0xe:
    QAbstractSocket::hostFound(*(QAbstractSocket **)(*(long *)(_o + 8) + 8));
    break;
  case 0xf:
    QSslSocketPrivate::_q_disconnectedSlot(*(QSslSocketPrivate **)(_o + 8));
    break;
  case 0x10:
    QSslSocketPrivate::_q_stateChangedSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
    break;
  case 0x11:
    QSslSocketPrivate::_q_errorSlot(*(QSslSocketPrivate **)(_o + 8),ConnectionRefusedError);
    break;
  case 0x12:
    QSslSocketPrivate::_q_readyReadSlot(*(QSslSocketPrivate **)(_o + 8));
    break;
  case 0x13:
    if (*(int *)(*(long *)(_o + 8) + 0x270) == 0) {
      QIODevice::channelReadyRead((int)*(undefined8 *)(*(long *)(_o + 8) + 8));
    }
    break;
  case 0x14:
    QSslSocketPrivate::_q_bytesWrittenSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
    break;
  case 0x15:
    if (*(int *)(*(long *)(_o + 8) + 0x270) == 0) {
      QIODevice::channelBytesWritten((int)*(undefined8 *)(*(long *)(_o + 8) + 8),(ulong)*_a[1]);
    }
    break;
  case 0x16:
    QIODevice::readChannelFinished();
    break;
  case 0x17:
    lVar2 = *(long *)(_o + 8);
    *(undefined1 *)(lVar2 + 0x401) = 0;
    if ((*(long *)(lVar2 + 0x98) != 0) && (*(long *)(*(long *)(lVar2 + 0x98) + 0x18) != 0)) {
      QAbstractSocket::flush(*(QAbstractSocket **)(lVar2 + 8));
    }
    break;
  case 0x18:
    if ((*(int *)(*(long *)(_o + 8) + 0x270) != 0) &&
       (plVar1 = *(long **)(*(long *)(_o + 8) + 0x408), plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 200))();
    }
    break;
  case 0x19:
    QSslSocketPrivate::_q_resumeImplementation(*(QSslSocketPrivate **)(_o + 8));
  }
LAB_0025543f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslSocket *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 2: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 3: _t->modeChanged((*reinterpret_cast< std::add_pointer_t<QSslSocket::SslMode>>(_a[1]))); break;
        case 4: _t->encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->newSessionTicketReceived(); break;
        case 7: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 8: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 9: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 10: _t->startClientEncryption(); break;
        case 11: _t->startServerEncryption(); break;
        case 12: _t->ignoreSslErrors(); break;
        case 13: _t->d_func()->_q_connectedSlot(); break;
        case 14: _t->d_func()->_q_hostFoundSlot(); break;
        case 15: _t->d_func()->_q_disconnectedSlot(); break;
        case 16: _t->d_func()->_q_stateChangedSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        case 17: _t->d_func()->_q_errorSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 18: _t->d_func()->_q_readyReadSlot(); break;
        case 19: _t->d_func()->_q_channelReadyReadSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->d_func()->_q_bytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 21: _t->d_func()->_q_channelBytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 22: _t->d_func()->_q_readChannelFinishedSlot(); break;
        case 23: _t->d_func()->_q_flushWriteBuffer(); break;
        case 24: _t->d_func()->_q_flushReadBuffer(); break;
        case 25: _t->d_func()->_q_resumeImplementation(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QList<QSslError> & )>(_a, &QSslSocket::sslErrors, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslSocket::SslMode )>(_a, &QSslSocket::modeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(qint64 )>(_a, &QSslSocket::encryptedBytesWritten, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QSslSocket::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::newSessionTicketReceived, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertReceived, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::handshakeInterruptedOnError, 9))
            return;
    }
}